

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O3

void socketio_dowork(CONCRETE_IO_HANDLE socket_io)

{
  uint __errnum;
  _Bool _Var1;
  int iVar2;
  LIST_ITEM_HANDLE item_handle;
  undefined8 *__ptr;
  ssize_t sVar3;
  LOGGER_LOG p_Var4;
  char *pcVar5;
  uint *puVar6;
  long lVar7;
  
  if (socket_io == (CONCRETE_IO_HANDLE)0x0) {
    return;
  }
  signal(0xd,(__sighandler_t)0x1);
  if (*(int *)((long)socket_io + 0x50) == 1) {
    if ((*(int *)((long)socket_io + 4) == 0) &&
       (_Var1 = dns_resolver_is_lookup_complete(*(DNSRESOLVER_HANDLE *)((long)socket_io + 0xa0)),
       !_Var1)) {
      *(undefined4 *)((long)socket_io + 0x50) = 1;
      return;
    }
    *(undefined4 *)((long)socket_io + 0x50) = 2;
    iVar2 = initiate_socket_connection((SOCKET_IO_INSTANCE *)socket_io);
    if (iVar2 == 0) {
      iVar2 = wait_for_socket_connection((SOCKET_IO_INSTANCE *)socket_io);
      if (iVar2 == 0) {
        return;
      }
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0013aad6;
      pcVar5 = "Socketio_Failure: wait_for_socket_connection failed";
      iVar2 = 0x475;
    }
    else {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0013aad6;
      pcVar5 = "Socketio_Failure: initiate_socket_connection failed";
      iVar2 = 0x470;
    }
    (*p_Var4)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/socketio_berkeley.c"
              ,"socketio_dowork",iVar2,1,pcVar5);
  }
  else {
    if (*(int *)((long)socket_io + 0x50) != 2) {
      return;
    }
    item_handle = singlylinkedlist_get_head_item
                            (*(SINGLYLINKEDLIST_HANDLE *)((long)socket_io + 0x58));
    while (item_handle != (LIST_ITEM_HANDLE)0x0) {
      __ptr = (undefined8 *)singlylinkedlist_item_get_value(item_handle);
      if (__ptr == (undefined8 *)0x0) {
        *(undefined4 *)((long)socket_io + 0x50) = 4;
        if (*(code **)((long)socket_io + 0x10) != (code *)0x0) {
          (**(code **)((long)socket_io + 0x10))();
        }
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/socketio_berkeley.c"
                    ,"socketio_dowork",0x410,1,"Failure: retrieving socket from list");
        }
        break;
      }
      sVar3 = send(*socket_io,(void *)*__ptr,__ptr[1],0x4000);
      if (sVar3 < 0) {
        if (sVar3 != -1) {
          lVar7 = __ptr[1];
          goto LAB_0013ab5b;
        }
        puVar6 = (uint *)__errno_location();
        if ((*puVar6 == 0xb) || (*puVar6 == 0x69)) break;
        free((void *)*__ptr);
        free(__ptr);
        singlylinkedlist_remove(*(SINGLYLINKEDLIST_HANDLE *)((long)socket_io + 0x58),item_handle);
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          __errnum = *puVar6;
          pcVar5 = strerror(__errnum);
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/socketio_berkeley.c"
                    ,"socketio_dowork",0x425,1,"Failure: sending Socket information. errno=%d (%s)."
                    ,(ulong)__errnum,pcVar5);
        }
        *(undefined4 *)((long)socket_io + 0x50) = 4;
        if (*(code **)((long)socket_io + 0x10) != (code *)0x0) {
          (**(code **)((long)socket_io + 0x10))(*(undefined8 *)((long)socket_io + 0x28));
        }
      }
      else {
        lVar7 = __ptr[1];
        if (sVar3 != lVar7) {
LAB_0013ab5b:
          memmove((void *)*__ptr,(void *)((long)*__ptr + sVar3),lVar7 - sVar3);
          __ptr[1] = __ptr[1] - sVar3;
          break;
        }
        if ((code *)__ptr[2] != (code *)0x0) {
          (*(code *)__ptr[2])(__ptr[3],1);
        }
        free((void *)*__ptr);
        free(__ptr);
        iVar2 = singlylinkedlist_remove
                          (*(SINGLYLINKEDLIST_HANDLE *)((long)socket_io + 0x58),item_handle);
        if (iVar2 != 0) {
          *(undefined4 *)((long)socket_io + 0x50) = 4;
          if (*(code **)((long)socket_io + 0x10) != (code *)0x0) {
            (**(code **)((long)socket_io + 0x10))();
          }
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/socketio_berkeley.c"
                      ,"socketio_dowork",0x43e,1,"Failure: unable to remove socket from list");
          }
        }
      }
      item_handle = singlylinkedlist_get_head_item
                              (*(SINGLYLINKEDLIST_HANDLE *)((long)socket_io + 0x58));
    }
    if (*(int *)((long)socket_io + 0x50) != 2) {
      return;
    }
    while( true ) {
      sVar3 = recv(*socket_io,(void *)((long)socket_io + 0x60),0x40,0x4000);
      if (sVar3 < 1) break;
      if (*(code **)((long)socket_io + 8) != (code *)0x0) {
        (**(code **)((long)socket_io + 8))
                  (*(undefined8 *)((long)socket_io + 0x20),(void *)((long)socket_io + 0x60),sVar3);
      }
      if (*(int *)((long)socket_io + 0x50) != 2) {
        return;
      }
    }
    if (sVar3 != 0) {
      puVar6 = (uint *)__errno_location();
      if (*puVar6 == 0xb) {
        return;
      }
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/socketio_berkeley.c"
                  ,"socketio_dowork",0x45a,1,
                  "Socketio_Failure: Receiving data from endpoint: errno=%d.",(ulong)*puVar6);
      }
    }
  }
LAB_0013aad6:
  *(undefined4 *)((long)socket_io + 0x50) = 4;
  if (*(code **)((long)socket_io + 0x10) == (code *)0x0) {
    return;
  }
  (**(code **)((long)socket_io + 0x10))(*(undefined8 *)((long)socket_io + 0x28));
  return;
}

Assistant:

void socketio_dowork(CONCRETE_IO_HANDLE socket_io)
{
    if (socket_io != NULL)
    {
        SOCKET_IO_INSTANCE* socket_io_instance = (SOCKET_IO_INSTANCE*)socket_io;
        signal(SIGPIPE, SIG_IGN);

        if (socket_io_instance->io_state == IO_STATE_OPEN)
        {
            LIST_ITEM_HANDLE first_pending_io = singlylinkedlist_get_head_item(socket_io_instance->pending_io_list);
            while (first_pending_io != NULL)
            {
                PENDING_SOCKET_IO* pending_socket_io = (PENDING_SOCKET_IO*)singlylinkedlist_item_get_value(first_pending_io);
                if (pending_socket_io == NULL)
                {
                    indicate_error(socket_io_instance);
                    LogError("Failure: retrieving socket from list");
                    break;
                }

                ssize_t send_result = send(socket_io_instance->socket, pending_socket_io->bytes, pending_socket_io->size, MSG_NOSIGNAL);
                if ((send_result < 0) || ((size_t)send_result != pending_socket_io->size))
                {
                    if (send_result == INVALID_SOCKET)
                    {
                        if (errno == EAGAIN  || errno == ENOBUFS) /*send says "come back later" with EAGAIN, ENOBUFS - likely the socket buffer cannot accept more data*/
                        {
                            /*do nothing until next dowork */
                            break;
                        }
                        else
                        {
                            free(pending_socket_io->bytes);
                            free(pending_socket_io);
                            pending_socket_io = NULL;
                            (void)singlylinkedlist_remove(socket_io_instance->pending_io_list, first_pending_io);

                            LogError("Failure: sending Socket information. errno=%d (%s).", errno, strerror(errno));
                            indicate_error(socket_io_instance);
                        }
                    }
                    else
                    {
                        /* simply wait until next dowork */
                        (void)memmove(pending_socket_io->bytes, pending_socket_io->bytes + send_result, pending_socket_io->size - send_result);
                        pending_socket_io->size -= send_result;
                        break;
                    }
                }
                else
                {
                    if (pending_socket_io->on_send_complete != NULL)
                    {
                        pending_socket_io->on_send_complete(pending_socket_io->callback_context, IO_SEND_OK);
                    }

                    free(pending_socket_io->bytes);
                    free(pending_socket_io);
                    pending_socket_io = NULL;
                    if (singlylinkedlist_remove(socket_io_instance->pending_io_list, first_pending_io) != 0)
                    {
                        indicate_error(socket_io_instance);
                        LogError("Failure: unable to remove socket from list");
                    }
                }

                first_pending_io = singlylinkedlist_get_head_item(socket_io_instance->pending_io_list);
            }

             if (socket_io_instance->io_state == IO_STATE_OPEN)
            {
                ssize_t received = 0;
                do
                {
                    received = recv(socket_io_instance->socket, socket_io_instance->recv_bytes, XIO_RECEIVE_BUFFER_SIZE, MSG_NOSIGNAL);
                    if (received > 0)
                    {
                        if (socket_io_instance->on_bytes_received != NULL)
                        {
                            /* Explicitly ignoring here the result of the callback */
                            (void)socket_io_instance->on_bytes_received(socket_io_instance->on_bytes_received_context, socket_io_instance->recv_bytes, received);
                        }
                    }
                    else if (received == 0)
                    {
                        // Do not log error here due to this is probably the socket being closed on the other end
                        indicate_error(socket_io_instance);
                    }
                    else if (received < 0 && errno != EAGAIN)
                    {
                        LogError("Socketio_Failure: Receiving data from endpoint: errno=%d.", errno);
                        indicate_error(socket_io_instance);
                    }

                } while (received > 0 && socket_io_instance->io_state == IO_STATE_OPEN);
            }
        }
        else
        {
            if (socket_io_instance->io_state == IO_STATE_OPENING)
            {
                if(lookup_address(socket_io_instance) != 0)
                {
                    LogError("Socketio_Failure: lookup address failed");
                    indicate_error(socket_io_instance);
                }
                else
                {
                    if(socket_io_instance->io_state == IO_STATE_OPEN)
                    {
                        if (initiate_socket_connection(socket_io_instance) != 0)
                        {
                            LogError("Socketio_Failure: initiate_socket_connection failed");
                            indicate_error(socket_io_instance);
                        }
                        else if (wait_for_socket_connection(socket_io_instance) != 0)
                        {
                            LogError("Socketio_Failure: wait_for_socket_connection failed");
                            indicate_error(socket_io_instance);
                        }
                    }
                }

            }
        }
    }
}